

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void transall(int p,int q,int P,int Q,double *old,double *new1)

{
  if (p != 0) {
    artrans(p,old,new1);
  }
  if (q != 0) {
    artrans(q,old + p,new1 + p);
    p = p + q;
  }
  if (P != 0) {
    artrans(P,old + p,new1 + p);
    p = p + P;
  }
  if (Q != 0) {
    artrans(Q,old + p,new1 + p);
    return;
  }
  return;
}

Assistant:

void transall(int p,int q, int P, int Q, double *old, double *new1) {
	int N;

	N = 0;

	if (p != 0) {
		artrans(p, old, new1);
		N = N + p;
	}

	if (q != 0) {
		artrans(q, old + N, new1 + N);
		N = N + q;
	}

	if(P != 0) {
		artrans(P, old + N, new1 + N);
		N = N + P;
	}

	if (Q != 0) {
		artrans(Q, old + N, new1 + N);
	}
}